

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

bool check_playing(DESCRIPTOR_DATA *d,char *name)

{
  bool bVar1;
  CHAR_DATA *pCVar2;
  DESCRIPTOR_DATA *pDVar3;
  bool bVar4;
  
  bVar4 = descriptor_list != (DESCRIPTOR_DATA *)0x0;
  pDVar3 = descriptor_list;
  if (bVar4) {
    do {
      if (((pDVar3 != d) && (pDVar3->character != (CHAR_DATA *)0x0)) &&
         (1 < (ushort)(pDVar3->connected - 1U))) {
        pCVar2 = pDVar3->character;
        if (pDVar3->original != (CHAR_DATA *)0x0) {
          pCVar2 = pDVar3->original;
        }
        bVar1 = str_cmp(name,pCVar2->true_name);
        if (!bVar1) {
          write_to_buffer(d,"That character is already playing.\n\r",0);
          write_to_buffer(d,"Do you wish to connect anyway (Y/N)?",0);
          d->connected = 0x11;
          return bVar4;
        }
      }
      bVar4 = pDVar3->next != (DESCRIPTOR_DATA *)0x0;
      pDVar3 = pDVar3->next;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool check_playing(DESCRIPTOR_DATA *d, char *name)
{
	DESCRIPTOR_DATA *dold;

	for (dold = descriptor_list; dold; dold = dold->next)
	{
		if (dold != d
			&& dold->character != nullptr
			&& dold->connected != CON_GET_NAME
			&& dold->connected != CON_GET_OLD_PASSWORD
			&& !str_cmp(name, dold->original ? dold->original->true_name : dold->character->true_name))
		{
			write_to_buffer(d, "That character is already playing.\n\r", 0);
			write_to_buffer(d, "Do you wish to connect anyway (Y/N)?", 0);

			d->connected = CON_BREAK_CONNECT;
			return true;
		}
	}

	return false;
}